

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O2

void google::DebugWriteToStderr(char *data,void *param_2)

{
  size_t __n;
  
  __n = strlen(data);
  write(2,data,__n);
  return;
}

Assistant:

static void DebugWriteToStderr(const char* data, void *) {
  // This one is signal-safe.
  if (write(STDERR_FILENO, data, strlen(data)) < 0) {
    // Ignore errors.
  }
#if defined(__ANDROID__)
  // ANDROID_LOG_FATAL as fatal error occurred and now is dumping call stack.
  __android_log_write(ANDROID_LOG_FATAL,
                      glog_internal_namespace_::ProgramInvocationShortName(),
                      data);
#endif
}